

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O3

qsizetype __thiscall
QResourcePrivate::decompress(QResourcePrivate *this,char *buffer,qsizetype bufferSize)

{
  uint uVar1;
  int iVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  uLong len;
  QMessageLogger local_40;
  qsizetype local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  qVar4 = -1;
  if (this->compressionAlgo == '\x02') {
    qVar3 = ZSTD_decompress(buffer,bufferSize,this->data,this->size);
    iVar2 = ZSTD_isError(qVar3);
    if (iVar2 != 0) {
      decompress();
      qVar3 = qVar4;
    }
  }
  else {
    qVar3 = qVar4;
    if ((this->compressionAlgo == '\x01') &&
       (local_20 = bufferSize, uVar1 = uncompress(buffer,&local_20,this->data + 4,this->size + -4),
       qVar3 = local_20, uVar1 != 0)) {
      local_40.context.version = 2;
      local_40.context._4_8_ = 0;
      local_40.context._12_8_ = 0;
      local_40.context.function._4_4_ = 0;
      local_40.context.category = "default";
      QMessageLogger::warning
                (&local_40,"QResource: error decompressing zlib content (%d)",(ulong)uVar1);
      qVar3 = qVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return qVar3;
}

Assistant:

qsizetype QResourcePrivate::decompress(char *buffer, qsizetype bufferSize) const
{
    Q_ASSERT(data);
#if defined(QT_NO_COMPRESS) && !QT_CONFIG(zstd)
    Q_UNUSED(buffer);
    Q_UNUSED(bufferSize);
#endif

    switch (compressionAlgo) {
    case QResource::NoCompression:
        Q_UNREACHABLE();
        break;

    case QResource::ZlibCompression: {
#ifndef QT_NO_COMPRESS
        uLong len = uLong(bufferSize);
        int res = ::uncompress(reinterpret_cast<Bytef *>(buffer), &len, data + sizeof(quint32),
                               uLong(size - sizeof(quint32)));
        if (res != Z_OK) {
            qWarning("QResource: error decompressing zlib content (%d)", res);
            return -1;
        }
        return len;
#else
        Q_UNREACHABLE();
#endif
    }

    case QResource::ZstdCompression: {
#if QT_CONFIG(zstd)
        size_t usize = ZSTD_decompress(buffer, bufferSize, data, size);
        if (ZSTD_isError(usize)) {
            qWarning("QResource: error decompressing zstd content: %s", ZSTD_getErrorName(usize));
            return -1;
        }
        return usize;
#else
        Q_UNREACHABLE();
#endif
    }
    }

    return -1;
}